

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

void __thiscall
QArrayDataPointer<ClassInfoDef>::reallocateAndGrow
          (QArrayDataPointer<ClassInfoDef> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<ClassInfoDef> *old)

{
  QArrayData *data;
  ClassInfoDef *pCVar1;
  Data *pDVar2;
  bool bVar3;
  long lVar4;
  qsizetype qVar5;
  long in_FS_OFFSET;
  pair<QArrayData_*,_void_*> pVar6;
  QArrayDataPointer<ClassInfoDef> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (old == (QArrayDataPointer<ClassInfoDef> *)0x0 && where == GrowsAtEnd) {
    data = &this->d->super_QArrayData;
    if (data == (QArrayData *)0x0) {
      bVar3 = true;
    }
    else {
      bVar3 = 1 < (data->ref_)._q_value.super___atomic_base<int>._M_i;
    }
    if ((0 < n) && (!bVar3)) {
      if (data == (QArrayData *)0x0) {
        qVar5 = 0;
        lVar4 = 0;
      }
      else {
        qVar5 = data->alloc;
        lVar4 = (this->size - data->alloc) +
                ((long)((long)this->ptr - ((ulong)((long)&data[1].alloc + 7U) & 0xfffffffffffffff0))
                >> 4) * -0x5555555555555555;
      }
      pVar6 = QArrayData::reallocateUnaligned(data,this->ptr,0x30,qVar5 + n + lVar4,Grow);
      this->d = (Data *)pVar6.first;
      this->ptr = (ClassInfoDef *)pVar6.second;
      goto LAB_00137158;
    }
  }
  local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.ptr = (ClassInfoDef *)&DAT_aaaaaaaaaaaaaaaa;
  allocateGrow(&local_38,this,n,where);
  if (this->size != 0) {
    if (this->d == (Data *)0x0) {
      bVar3 = true;
    }
    else {
      bVar3 = 1 < (this->d->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
    }
    pCVar1 = this->ptr;
    if ((old != (QArrayDataPointer<ClassInfoDef> *)0x0) || (bVar3)) {
      QtPrivate::QGenericArrayOps<ClassInfoDef>::copyAppend
                ((QGenericArrayOps<ClassInfoDef> *)&local_38,pCVar1,
                 pCVar1 + (n >> 0x3f & n) + this->size);
    }
    else {
      QtPrivate::QGenericArrayOps<ClassInfoDef>::moveAppend
                ((QGenericArrayOps<ClassInfoDef> *)&local_38,pCVar1,
                 pCVar1 + (n >> 0x3f & n) + this->size);
    }
  }
  pDVar2 = this->d;
  pCVar1 = this->ptr;
  this->d = local_38.d;
  this->ptr = local_38.ptr;
  qVar5 = this->size;
  this->size = local_38.size;
  local_38.d = pDVar2;
  local_38.ptr = pCVar1;
  local_38.size = qVar5;
  if (old != (QArrayDataPointer<ClassInfoDef> *)0x0) {
    local_38.d = old->d;
    local_38.ptr = old->ptr;
    old->d = pDVar2;
    old->ptr = pCVar1;
    local_38.size = old->size;
    old->size = qVar5;
  }
  ~QArrayDataPointer(&local_38);
LAB_00137158:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }